

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall trun::Config::Config(Config *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ILogger *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  string *local_40;
  string *local_38;
  
  local_50 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->testcases;
  local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->inputs;
  local_58 = &this->version;
  local_68 = &(this->version).field_2;
  (this->inputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testcases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testcases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modules).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->testcases).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modules).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->version)._M_dataplus._M_p = (pointer)local_68;
  (this->version)._M_string_length = 0;
  (this->version).field_2._M_local_buf[0] = '\0';
  local_60 = &this->description;
  local_70 = &(this->description).field_2;
  (this->description)._M_dataplus._M_p = (pointer)local_70;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->appName).field_2;
  (this->appName)._M_dataplus._M_p = (pointer)local_78;
  (this->appName)._M_string_length = 0;
  (this->appName).field_2._M_local_buf[0] = '\0';
  this->verbose = 0;
  this->responseMsgByteLimit = 0x2000;
  local_80 = &(this->mainFuncName).field_2;
  (this->mainFuncName)._M_dataplus._M_p = (pointer)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->mainFuncName,"main","");
  local_88 = &(this->exitFuncName).field_2;
  (this->exitFuncName)._M_dataplus._M_p = (pointer)local_88;
  local_38 = &this->mainFuncName;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->exitFuncName,"exit","");
  (this->reportingModule)._M_dataplus._M_p = (pointer)&(this->reportingModule).field_2;
  local_40 = &this->exitFuncName;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->reportingModule,"console","");
  (this->reportFile)._M_dataplus._M_p = (pointer)&(this->reportFile).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->reportFile,"-","");
  this->reportIndent = 8;
  this->executeTests = true;
  this->listTests = false;
  this->printPassSummary = false;
  this->testModuleGlobals = true;
  this->testGlobalMain = true;
  this->testLogFilter = false;
  this->skipOnModuleFail = true;
  this->stopOnAllFail = true;
  this->suppressProgressMsg = false;
  this->discardTestReturnCode = false;
  this->linuxUseDeepBinding = true;
  this->continueOnAssert = false;
  this->testExecutionType = kThreaded;
  this->moduleExecuteType = kSequential;
  this->isSubProcess = false;
  this->useITestingVersion = 1;
  this->pLogger = (ILogger *)0x0;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,".","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_48,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"-","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"-","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_50,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (local_58,0,(this->version)._M_string_length,"<unknown>",9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (local_60,0,(this->description)._M_string_length,"C/C++ Unit Test Runner",0x16);
  this->testExecutionType = kSequential;
  this->moduleExecuteType = kSequential;
  gnilk::Logger::Initialize();
  gnilk::Logger::SetAllSinkDebugLevel(kDebug);
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"main","");
  pIVar2 = gnilk::Logger::GetLogger(&local_a8);
  this->pLogger = pIVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Config::Config() {
    // set default
    inputs.push_back(".");    // Search current directory
    modules.push_back("-");
    testcases.push_back("-");
#ifdef TRUN_VERSION
    version = TRUN_VERSION;
#else
    version = "<unknown>";
#endif
    description = "C/C++ Unit Test Runner";
#ifdef TRUN_HAVE_FORK
    testExecutionType = TestExecutiontype::kThreaded;
    moduleExecuteType = ModuleExecutionType::kParallel;
#else
    testExecutionType = TestExecutiontype::kSequential;
    moduleExecuteType = ModuleExecutionType::kSequential;
#endif

    //
    // Setup logger
    //
    auto logLevel = gnilk::LogLevel::kDebug;
	gnilk::Logger::Initialize();
	//if (logLevel != gnilk::LogLevel::kNone) {
        // Note: Console already added
        //auto consoleSink = gnilk::LogConsoleSink::Create();
        //gnilk::Logger::AddSink(consoleSink, "Console");
		//gnilk::Logger::AddSink(gnilk::Logger::CreateSink("LogConsoleSink"), "console", 0, NULL);
	//}
	gnilk::Logger::SetAllSinkDebugLevel(logLevel);
    pLogger = gnilk::Logger::GetLogger("main");
}